

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,ScanStmt *node)

{
  pointer pIVar1;
  ostream *this_00;
  ScanStmt *node_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&std::cout,"scan ");
  pIVar1 = std::unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_>::operator->
                     (&node->m_ident);
  (*(pIVar1->super_Expr).super_Stmt._vptr_Stmt[2])(pIVar1,this);
  this_00 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::ScanStmt *node) {
    std::cout << "scan ";
    node->m_ident->accept(this);
    std::cout << ";" << std::endl;
}